

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Constr.c
# Opt level: O2

Vec_Int_t * Llb_ManComputeBaseCase(Aig_Man_t *p,DdManager *dd)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  Vec_Int_t *p_00;
  int *__s;
  void *pvVar4;
  int iVar5;
  int iVar6;
  Vec_Ptr_t *p_01;
  
  pvVar3 = Vec_PtrEntry(p->vCos,0);
  p_01 = p->vObjs;
  iVar5 = p_01->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar6 = iVar5;
  }
  p_00->nCap = iVar6;
  if (iVar6 == 0) {
    p_00->pArray = (int *)0x0;
    p_00->nSize = iVar5;
  }
  else {
    __s = (int *)malloc((long)iVar6 << 2);
    p_00->pArray = __s;
    p_00->nSize = iVar5;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)iVar5 << 2);
    }
  }
  iVar6 = 0;
  do {
    if (iVar5 <= iVar6) {
      return p_00;
    }
    pvVar4 = Vec_PtrEntry(p_01,iVar6);
    if ((pvVar4 != (void *)0x0) &&
       ((uVar1 = *(uint *)((long)pvVar4 + 0x18) & 7, uVar1 == 2 || (uVar1 - 5 < 2)))) {
      iVar2 = Cudd_bddLeq(dd,*(DdNode **)((long)pvVar4 + 0x28),
                          (DdNode *)(*(ulong *)((long)pvVar3 + 0x28) ^ 1));
      iVar5 = 1;
      if (iVar2 == 0) {
        iVar2 = Cudd_bddLeq(dd,(DdNode *)(*(ulong *)((long)pvVar4 + 0x28) ^ 1),
                            (DdNode *)(*(ulong *)((long)pvVar3 + 0x28) ^ 1));
        iVar5 = 0;
        if (iVar2 == 0) goto LAB_0075b48b;
      }
      Vec_IntWriteEntry(p_00,iVar6,iVar5);
    }
LAB_0075b48b:
    iVar6 = iVar6 + 1;
    p_01 = p->vObjs;
    iVar5 = p_01->nSize;
  } while( true );
}

Assistant:

Vec_Int_t * Llb_ManComputeBaseCase( Aig_Man_t * p, DdManager * dd )
{
    Vec_Int_t * vNodes;
    Aig_Obj_t * pObj, * pRoot;
    int i;
    pRoot = Aig_ManCo( p, 0 );
    vNodes = Vec_IntStartFull( Aig_ManObjNumMax(p) );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        if ( Cudd_bddLeq( dd, (DdNode *)pObj->pData, Cudd_Not(pRoot->pData) ) )
            Vec_IntWriteEntry( vNodes, i, 1 );
        else if ( Cudd_bddLeq( dd, Cudd_Not((DdNode *)pObj->pData), Cudd_Not(pRoot->pData) ) )
            Vec_IntWriteEntry( vNodes, i, 0 );
    }
    return vNodes;
}